

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraIndVer.c
# Opt level: O0

int Fra_InvariantVerify(Aig_Man_t *pAig,int nFrames,Vec_Int_t *vClauses,Vec_Int_t *vLits)

{
  int iVar1;
  lit lVar2;
  int iVar3;
  uint uVar4;
  abctime aVar5;
  Cnf_Dat_t *p;
  sat_solver *psVar6;
  int *piVar7;
  abctime aVar8;
  abctime clk;
  uint local_60;
  int CounterInd;
  int CounterBase;
  int k;
  int i;
  int End;
  int Beg;
  int RetValue;
  int *pStart;
  sat_solver *pSat;
  Cnf_Dat_t *pCnf;
  Vec_Int_t *vLits_local;
  Vec_Int_t *vClauses_local;
  int nFrames_local;
  Aig_Man_t *pAig_local;
  
  local_60 = 0;
  clk._4_4_ = 0;
  aVar5 = Abc_Clock();
  if (nFrames == 1) {
    iVar1 = Aig_ManCoNum(pAig);
    p = Cnf_DeriveSimple(pAig,iVar1);
    psVar6 = (sat_solver *)Cnf_DataWriteIntoSolver(p,1,1);
    i = 0;
    piVar7 = Vec_IntArray(vLits);
    for (CounterBase = 0; iVar1 = Vec_IntSize(vClauses), CounterBase < iVar1;
        CounterBase = CounterBase + 1) {
      iVar1 = Vec_IntEntry(vClauses,CounterBase);
      for (CounterInd = i; CounterInd < iVar1; CounterInd = CounterInd + 1) {
        lVar2 = lit_neg(piVar7[CounterInd]);
        piVar7[CounterInd] = lVar2;
      }
      iVar3 = sat_solver_solve(psVar6,piVar7 + i,piVar7 + iVar1,0,0,0,0);
      for (CounterInd = i; CounterInd < iVar1; CounterInd = CounterInd + 1) {
        lVar2 = lit_neg(piVar7[CounterInd]);
        piVar7[CounterInd] = lVar2;
      }
      if (iVar3 != -1) {
        local_60 = local_60 + 1;
      }
      i = iVar1;
    }
    sat_solver_delete(psVar6);
    psVar6 = (sat_solver *)Cnf_DataWriteIntoSolver(p,2,0);
    if (psVar6->size != p->nVars * 2) {
      __assert_fail("pSat->size == 2 * pCnf->nVars",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraIndVer.c"
                    ,100,"int Fra_InvariantVerify(Aig_Man_t *, int, Vec_Int_t *, Vec_Int_t *)");
    }
    i = 0;
    piVar7 = Vec_IntArray(vLits);
    for (CounterBase = 0; iVar1 = Vec_IntSize(vClauses), CounterBase < iVar1;
        CounterBase = CounterBase + 1) {
      iVar1 = Vec_IntEntry(vClauses,CounterBase);
      iVar3 = sat_solver_addclause(psVar6,piVar7 + i,piVar7 + iVar1);
      if (iVar3 == 0) {
        Cnf_DataFree(p);
        sat_solver_delete(psVar6);
        printf("Invariant verification: SAT solver is unsat after adding a clause.\n");
        return 0;
      }
      i = iVar1;
    }
    if (psVar6->qtail != psVar6->qhead) {
      iVar1 = sat_solver_simplify(psVar6);
      if (iVar1 == 0) {
        __assert_fail("RetValue != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraIndVer.c"
                      ,0x78,"int Fra_InvariantVerify(Aig_Man_t *, int, Vec_Int_t *, Vec_Int_t *)");
      }
      if (psVar6->qtail != psVar6->qhead) {
        __assert_fail("pSat->qtail == pSat->qhead",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraIndVer.c"
                      ,0x79,"int Fra_InvariantVerify(Aig_Man_t *, int, Vec_Int_t *, Vec_Int_t *)");
      }
    }
    i = 0;
    piVar7 = Vec_IntArray(vLits);
    for (CounterBase = 0; iVar1 = Vec_IntSize(vClauses), CounterBase < iVar1;
        CounterBase = CounterBase + 1) {
      iVar1 = Vec_IntEntry(vClauses,CounterBase);
      for (CounterInd = i; CounterInd < iVar1; CounterInd = CounterInd + 1) {
        piVar7[CounterInd] = p->nVars * 2 + piVar7[CounterInd];
        lVar2 = lit_neg(piVar7[CounterInd]);
        piVar7[CounterInd] = lVar2;
      }
      iVar3 = sat_solver_solve(psVar6,piVar7 + i,piVar7 + iVar1,0,0,0,0);
      for (CounterInd = i; CounterInd < iVar1; CounterInd = CounterInd + 1) {
        lVar2 = lit_neg(piVar7[CounterInd]);
        piVar7[CounterInd] = lVar2;
        piVar7[CounterInd] = piVar7[CounterInd] + p->nVars * -2;
      }
      if (iVar3 != -1) {
        clk._4_4_ = clk._4_4_ + 1;
      }
      i = iVar1;
    }
    sat_solver_delete(psVar6);
    Cnf_DataFree(p);
    if (local_60 != 0) {
      uVar4 = Vec_IntSize(vClauses);
      printf("Invariant verification: %d clauses (out of %d) FAILED the base case.\n",
             (ulong)local_60,(ulong)uVar4);
    }
    if (clk._4_4_ != 0) {
      uVar4 = Vec_IntSize(vClauses);
      printf("Invariant verification: %d clauses (out of %d) FAILED the inductive case.\n",
             (ulong)clk._4_4_,(ulong)uVar4);
    }
    if ((local_60 == 0) && (clk._4_4_ == 0)) {
      uVar4 = Vec_IntSize(vClauses);
      printf("Invariant verification: %d clauses verified correctly.  ",(ulong)uVar4);
      Abc_Print(1,"%s =","Time");
      aVar8 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar8 - aVar5) * 1.0) / 1000000.0);
      pAig_local._4_4_ = 1;
    }
    else {
      pAig_local._4_4_ = 0;
    }
  }
  else {
    printf("Invariant verification: Can only verify for K = 1\n");
    pAig_local._4_4_ = 1;
  }
  return pAig_local._4_4_;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Verifies the inductive invariant.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Fra_InvariantVerify( Aig_Man_t * pAig, int nFrames, Vec_Int_t * vClauses, Vec_Int_t * vLits )
{
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    int * pStart;
    int RetValue, Beg, End, i, k;
    int CounterBase = 0, CounterInd = 0;
    abctime clk = Abc_Clock();

    if ( nFrames != 1 )
    {
        printf( "Invariant verification: Can only verify for K = 1\n" );
        return 1;
    }

    // derive CNF
    pCnf = Cnf_DeriveSimple( pAig, Aig_ManCoNum(pAig) );
/*
    // add the property
    {
        Aig_Obj_t * pObj;
        int Lits[1];

        pObj = Aig_ManCo( pAig, 0 );
        Lits[0] = toLitCond( pCnf->pVarNums[pObj->Id], 1 ); 

        Vec_IntPush( vLits, Lits[0] );
        Vec_IntPush( vClauses, Vec_IntSize(vLits) );
        printf( "Added the target property to the set of clauses to be inductively checked.\n" );
    }
*/
    // derive initialized frames for the base case
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, nFrames, 1 );
    // check clauses in the base case
    Beg = 0;
    pStart = Vec_IntArray( vLits );
    Vec_IntForEachEntry( vClauses, End, i )
    {
        // complement the literals
        for ( k = Beg; k < End; k++ )
            pStart[k] = lit_neg(pStart[k]);
        RetValue = sat_solver_solve( pSat, pStart + Beg, pStart + End, 0, 0, 0, 0 );
        for ( k = Beg; k < End; k++ )
            pStart[k] = lit_neg(pStart[k]);
        Beg = End;
        if ( RetValue == l_False )
            continue;
//        printf( "Clause %d failed the base case.\n", i );
        CounterBase++;
    }
    sat_solver_delete( pSat );

    // derive initialized frames for the base case
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, nFrames + 1, 0 );
    assert( pSat->size == 2 * pCnf->nVars );
    // add clauses to the first frame
    Beg = 0;
    pStart = Vec_IntArray( vLits );
    Vec_IntForEachEntry( vClauses, End, i )
    {
        RetValue = sat_solver_addclause( pSat, pStart + Beg, pStart + End );
        Beg = End;
        if ( RetValue == 0 )
        {
            Cnf_DataFree( pCnf );
            sat_solver_delete( pSat );
            printf( "Invariant verification: SAT solver is unsat after adding a clause.\n" );
            return 0;
        }
    }
    // simplify the solver
    if ( pSat->qtail != pSat->qhead )
    {
        RetValue = sat_solver_simplify(pSat);
        assert( RetValue != 0 );
        assert( pSat->qtail == pSat->qhead );
    }

    // check clauses in the base case
    Beg = 0;
    pStart = Vec_IntArray( vLits );
    Vec_IntForEachEntry( vClauses, End, i )
    {
        // complement the literals
        for ( k = Beg; k < End; k++ )
        {
            pStart[k] += 2 * pCnf->nVars;
            pStart[k] = lit_neg(pStart[k]);
        }
        RetValue = sat_solver_solve( pSat, pStart + Beg, pStart + End, 0, 0, 0, 0 );
        for ( k = Beg; k < End; k++ )
        {
            pStart[k] = lit_neg(pStart[k]);
            pStart[k] -= 2 * pCnf->nVars;
        }
        Beg = End;
        if ( RetValue == l_False )
            continue;
//        printf( "Clause %d failed the inductive case.\n", i );
        CounterInd++;
    }
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    if ( CounterBase )
        printf( "Invariant verification: %d clauses (out of %d) FAILED the base case.\n", CounterBase, Vec_IntSize(vClauses) );
    if ( CounterInd )
        printf( "Invariant verification: %d clauses (out of %d) FAILED the inductive case.\n", CounterInd, Vec_IntSize(vClauses) );
    if ( CounterBase || CounterInd )
        return 0;
    printf( "Invariant verification: %d clauses verified correctly.  ", Vec_IntSize(vClauses) );
    ABC_PRT( "Time", Abc_Clock() - clk );
    return 1;
}